

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_backup_step(sqlite3_backup *p,int nPage)

{
  int *piVar1;
  u8 uVar2;
  u32 uVar3;
  sqlite3_mutex *psVar4;
  BtShared *pBVar5;
  BtShared *pBVar6;
  Pager *pPVar7;
  bool bVar8;
  DbPage *pDVar9;
  sqlite3_file *psVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  Btree *pBVar14;
  Pgno PVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  DbPage *pSrcPg;
  DbPage *local_68;
  Pager *local_60;
  u32 local_54;
  long local_50;
  ulong local_48;
  sqlite3_file *local_40;
  Pager *local_38;
  
  psVar4 = p->pSrcDb->mutex;
  if (psVar4 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar4);
  }
  sqlite3BtreeEnter(p->pSrc);
  if ((p->pDestDb != (sqlite3 *)0x0) && (psVar4 = p->pDestDb->mutex, psVar4 != (sqlite3_mutex *)0x0)
     ) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar4);
  }
  uVar12 = p->rc;
  if ((6 < uVar12) || ((0x61U >> (uVar12 & 0x1f) & 1) == 0)) goto LAB_0014a92a;
  pBVar14 = p->pSrc;
  local_38 = pBVar14->pBt->pPager;
  local_60 = p->pDest->pBt->pPager;
  if ((p->pDestDb == (sqlite3 *)0x0) || (pBVar14->pBt->inTransaction != '\x02')) {
    if (p->bDestLocked == 0) {
      uVar12 = sqlite3BtreeBeginTrans(p->pDest,2);
      if (uVar12 != 0) goto LAB_0014a4bc;
      p->bDestLocked = 1;
      sqlite3BtreeGetMeta(p->pDest,1,&p->iDestSchema);
      pBVar14 = p->pSrc;
    }
    if (pBVar14->inTrans != '\0') {
      uVar12 = 0;
      goto LAB_0014a4bc;
    }
    bVar8 = false;
    uVar12 = sqlite3BtreeBeginTrans(pBVar14,0);
  }
  else {
    uVar12 = 5;
LAB_0014a4bc:
    bVar8 = true;
  }
  pBVar5 = p->pSrc->pBt;
  uVar3 = pBVar5->pageSize;
  local_48 = (ulong)(int)uVar3;
  pBVar6 = p->pDest->pBt;
  local_54 = pBVar6->pageSize;
  uVar2 = pBVar6->pPager->journalMode;
  local_50 = CONCAT71(local_50._1_7_,uVar2);
  uVar11 = (uint)(uVar3 != local_54) << 3;
  if (uVar2 != '\x05') {
    uVar11 = uVar12;
  }
  if (uVar12 != 0) {
    uVar11 = uVar12;
  }
  uVar12 = pBVar5->nPage;
  if (nPage != 0) {
    PVar15 = p->iNext;
    iVar13 = 1;
    local_40 = (sqlite3_file *)CONCAT44(local_40._4_4_,nPage);
    do {
      if ((uVar12 < PVar15) || (uVar11 != 0)) break;
      uVar11 = 0;
      if (PVar15 != (uint)sqlite3PendingByte / p->pSrc->pBt->pageSize + 1) {
        uVar11 = sqlite3PagerAcquire(local_38,PVar15,&local_68,2);
        pDVar9 = local_68;
        if (uVar11 == 0) {
          uVar11 = backupOnePage(p,PVar15,(u8 *)local_68->pData,0);
          nPage = (int)local_40;
          sqlite3PagerUnref(pDVar9);
        }
        PVar15 = p->iNext;
      }
      PVar15 = PVar15 + 1;
      p->iNext = PVar15;
      bVar18 = iVar13 < nPage;
      iVar13 = iVar13 + 1;
    } while (bVar18 || nPage < 0);
  }
  if (uVar11 == 0x65) {
LAB_0014a5dc:
    if (uVar12 == 0) {
      pBVar14 = p->pDest;
      sqlite3BtreeEnter(pBVar14);
      pBVar5 = pBVar14->pBt;
      pBVar5->nPage = 0;
      uVar11 = newDatabase(pBVar5);
      if (pBVar14->sharable != '\0') {
        piVar1 = &pBVar14->wantToLock;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          psVar4 = pBVar14->pBt->mutex;
          if (psVar4 != (sqlite3_mutex *)0x0) {
            (*sqlite3Config.mutex.xMutexLeave)(psVar4);
          }
          pBVar14->locked = '\0';
        }
      }
      uVar12 = 1;
      if ((uVar11 != 0x65) && (uVar11 != 0)) goto LAB_0014a8fa;
    }
    uVar11 = sqlite3BtreeUpdateMeta(p->pDest,1,p->iDestSchema + 1);
    if (uVar11 == 0) {
      if (p->pDestDb != (sqlite3 *)0x0) {
        sqlite3ResetAllSchemasOfConnection(p->pDestDb);
      }
      if (((char)local_50 != '\x05') || (uVar11 = sqlite3BtreeSetVersion(p->pDest,2), uVar11 == 0))
      {
        iVar13 = (int)local_48;
        if (iVar13 < (int)local_54) {
          iVar13 = (int)(uVar12 + (int)local_54 / iVar13 + -1) / ((int)local_54 / iVar13);
          PVar15 = iVar13 - (uint)(iVar13 == (uint)sqlite3PendingByte / p->pDest->pBt->pageSize + 1)
          ;
          local_50 = (long)(int)uVar12 * local_48;
          local_40 = local_60->fd;
          uVar12 = local_60->dbSize;
          if (uVar12 < PVar15) {
LAB_0014a7a5:
            lVar16 = local_50;
            uVar11 = sqlite3PagerCommitPhaseOne(local_60,(char *)0x0,1);
          }
          else {
            do {
              uVar11 = 0;
              if ((PVar15 != (uint)sqlite3PendingByte / p->pDest->pBt->pageSize + 1) &&
                 (uVar11 = sqlite3PagerAcquire(local_60,PVar15,&local_68,0), pDVar9 = local_68,
                 uVar11 == 0)) {
                uVar11 = sqlite3PagerWrite(local_68);
                sqlite3PagerUnref(pDVar9);
              }
            } while ((uVar11 == 0) && (PVar15 = PVar15 + 1, PVar15 <= uVar12));
            lVar16 = local_50;
            if (uVar11 == 0) goto LAB_0014a7a5;
          }
          lVar17 = (long)(int)(local_54 + sqlite3PendingByte);
          if (lVar16 < (int)(local_54 + sqlite3PendingByte)) {
            lVar17 = lVar16;
          }
          bVar18 = uVar11 == 0;
          if ((bVar18) && (lVar16 = (long)(sqlite3PendingByte + (int)local_48), lVar16 < lVar17)) {
            do {
              local_68 = (DbPage *)0x0;
              uVar11 = sqlite3PagerAcquire(local_38,(int)(lVar16 / (long)local_48) + 1,&local_68,0);
              pDVar9 = local_68;
              if (uVar11 == 0) {
                uVar11 = (*local_40->pMethods->xWrite)
                                   (local_40,local_68->pData,(int)local_48,lVar16);
              }
              sqlite3PagerUnref(pDVar9);
              bVar18 = uVar11 == 0;
            } while ((bVar18) && (lVar16 = lVar16 + local_48, lVar16 < lVar17));
          }
          psVar10 = local_40;
          if (((!bVar18) ||
              (uVar11 = (*local_40->pMethods->xFileSize)(local_40,(sqlite3_int64 *)&local_68),
              uVar11 != 0)) ||
             ((local_50 < (long)local_68 &&
              (uVar11 = (*psVar10->pMethods->xTruncate)(psVar10,local_50), uVar11 != 0))))
          goto LAB_0014a8fa;
          uVar11 = sqlite3PagerSync(local_60);
        }
        else {
          local_60->dbSize =
               (int)((long)((ulong)(uint)(iVar13 >> 0x1f) << 0x20 | local_48 & 0xffffffff) /
                    (long)(int)local_54) * uVar12;
          uVar11 = sqlite3PagerCommitPhaseOne(local_60,(char *)0x0,0);
        }
        if (uVar11 == 0) {
          uVar12 = sqlite3BtreeCommitPhaseTwo(p->pDest,0);
          uVar11 = 0x65;
          if (uVar12 != 0) {
            uVar11 = uVar12;
          }
        }
      }
    }
  }
  else if (uVar11 == 0) {
    p->nPagecount = uVar12;
    p->nRemaining = (uVar12 - p->iNext) + 1;
    if (uVar12 < p->iNext) goto LAB_0014a5dc;
    uVar11 = 0;
    if (p->isAttached == 0) {
      pPVar7 = p->pSrc->pBt->pPager;
      p->pNext = pPVar7->pBackup;
      pPVar7->pBackup = p;
      p->isAttached = 1;
    }
  }
LAB_0014a8fa:
  if (!bVar8) {
    sqlite3BtreeCommitPhaseOne(p->pSrc,(char *)0x0);
    sqlite3BtreeCommitPhaseTwo(p->pSrc,0);
  }
  uVar12 = 7;
  if (uVar11 != 0xc0a) {
    uVar12 = uVar11;
  }
  p->rc = uVar12;
LAB_0014a92a:
  if ((p->pDestDb != (sqlite3 *)0x0) && (psVar4 = p->pDestDb->mutex, psVar4 != (sqlite3_mutex *)0x0)
     ) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar4);
  }
  pBVar14 = p->pSrc;
  if (pBVar14->sharable != '\0') {
    piVar1 = &pBVar14->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      psVar4 = pBVar14->pBt->mutex;
      if (psVar4 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar4);
      }
      pBVar14->locked = '\0';
    }
  }
  psVar4 = p->pSrcDb->mutex;
  if (psVar4 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar4);
  }
  return uVar12;
}

Assistant:

SQLITE_API int sqlite3_backup_step(sqlite3_backup *p, int nPage){
  int rc;
  int destMode;       /* Destination journal mode */
  int pgszSrc = 0;    /* Source page size */
  int pgszDest = 0;   /* Destination page size */

  sqlite3_mutex_enter(p->pSrcDb->mutex);
  sqlite3BtreeEnter(p->pSrc);
  if( p->pDestDb ){
    sqlite3_mutex_enter(p->pDestDb->mutex);
  }

  rc = p->rc;
  if( !isFatalError(rc) ){
    Pager * const pSrcPager = sqlite3BtreePager(p->pSrc);     /* Source pager */
    Pager * const pDestPager = sqlite3BtreePager(p->pDest);   /* Dest pager */
    int ii;                            /* Iterator variable */
    int nSrcPage = -1;                 /* Size of source db in pages */
    int bCloseTrans = 0;               /* True if src db requires unlocking */

    /* If the source pager is currently in a write-transaction, return
    ** SQLITE_BUSY immediately.
    */
    if( p->pDestDb && p->pSrc->pBt->inTransaction==TRANS_WRITE ){
      rc = SQLITE_BUSY;
    }else{
      rc = SQLITE_OK;
    }

    /* Lock the destination database, if it is not locked already. */
    if( SQLITE_OK==rc && p->bDestLocked==0
     && SQLITE_OK==(rc = sqlite3BtreeBeginTrans(p->pDest, 2)) 
    ){
      p->bDestLocked = 1;
      sqlite3BtreeGetMeta(p->pDest, BTREE_SCHEMA_VERSION, &p->iDestSchema);
    }

    /* If there is no open read-transaction on the source database, open
    ** one now. If a transaction is opened here, then it will be closed
    ** before this function exits.
    */
    if( rc==SQLITE_OK && 0==sqlite3BtreeIsInReadTrans(p->pSrc) ){
      rc = sqlite3BtreeBeginTrans(p->pSrc, 0);
      bCloseTrans = 1;
    }

    /* Do not allow backup if the destination database is in WAL mode
    ** and the page sizes are different between source and destination */
    pgszSrc = sqlite3BtreeGetPageSize(p->pSrc);
    pgszDest = sqlite3BtreeGetPageSize(p->pDest);
    destMode = sqlite3PagerGetJournalMode(sqlite3BtreePager(p->pDest));
    if( SQLITE_OK==rc && destMode==PAGER_JOURNALMODE_WAL && pgszSrc!=pgszDest ){
      rc = SQLITE_READONLY;
    }
  
    /* Now that there is a read-lock on the source database, query the
    ** source pager for the number of pages in the database.
    */
    nSrcPage = (int)sqlite3BtreeLastPage(p->pSrc);
    assert( nSrcPage>=0 );
    for(ii=0; (nPage<0 || ii<nPage) && p->iNext<=(Pgno)nSrcPage && !rc; ii++){
      const Pgno iSrcPg = p->iNext;                 /* Source page number */
      if( iSrcPg!=PENDING_BYTE_PAGE(p->pSrc->pBt) ){
        DbPage *pSrcPg;                             /* Source page object */
        rc = sqlite3PagerAcquire(pSrcPager, iSrcPg, &pSrcPg,
                                 PAGER_ACQUIRE_READONLY);
        if( rc==SQLITE_OK ){
          rc = backupOnePage(p, iSrcPg, sqlite3PagerGetData(pSrcPg), 0);
          sqlite3PagerUnref(pSrcPg);
        }
      }
      p->iNext++;
    }
    if( rc==SQLITE_OK ){
      p->nPagecount = nSrcPage;
      p->nRemaining = nSrcPage+1-p->iNext;
      if( p->iNext>(Pgno)nSrcPage ){
        rc = SQLITE_DONE;
      }else if( !p->isAttached ){
        attachBackupObject(p);
      }
    }
  
    /* Update the schema version field in the destination database. This
    ** is to make sure that the schema-version really does change in
    ** the case where the source and destination databases have the
    ** same schema version.
    */
    if( rc==SQLITE_DONE ){
      if( nSrcPage==0 ){
        rc = sqlite3BtreeNewDb(p->pDest);
        nSrcPage = 1;
      }
      if( rc==SQLITE_OK || rc==SQLITE_DONE ){
        rc = sqlite3BtreeUpdateMeta(p->pDest,1,p->iDestSchema+1);
      }
      if( rc==SQLITE_OK ){
        if( p->pDestDb ){
          sqlite3ResetAllSchemasOfConnection(p->pDestDb);
        }
        if( destMode==PAGER_JOURNALMODE_WAL ){
          rc = sqlite3BtreeSetVersion(p->pDest, 2);
        }
      }
      if( rc==SQLITE_OK ){
        int nDestTruncate;
        /* Set nDestTruncate to the final number of pages in the destination
        ** database. The complication here is that the destination page
        ** size may be different to the source page size. 
        **
        ** If the source page size is smaller than the destination page size, 
        ** round up. In this case the call to sqlite3OsTruncate() below will
        ** fix the size of the file. However it is important to call
        ** sqlite3PagerTruncateImage() here so that any pages in the 
        ** destination file that lie beyond the nDestTruncate page mark are
        ** journalled by PagerCommitPhaseOne() before they are destroyed
        ** by the file truncation.
        */
        assert( pgszSrc==sqlite3BtreeGetPageSize(p->pSrc) );
        assert( pgszDest==sqlite3BtreeGetPageSize(p->pDest) );
        if( pgszSrc<pgszDest ){
          int ratio = pgszDest/pgszSrc;
          nDestTruncate = (nSrcPage+ratio-1)/ratio;
          if( nDestTruncate==(int)PENDING_BYTE_PAGE(p->pDest->pBt) ){
            nDestTruncate--;
          }
        }else{
          nDestTruncate = nSrcPage * (pgszSrc/pgszDest);
        }
        assert( nDestTruncate>0 );

        if( pgszSrc<pgszDest ){
          /* If the source page-size is smaller than the destination page-size,
          ** two extra things may need to happen:
          **
          **   * The destination may need to be truncated, and
          **
          **   * Data stored on the pages immediately following the 
          **     pending-byte page in the source database may need to be
          **     copied into the destination database.
          */
          const i64 iSize = (i64)pgszSrc * (i64)nSrcPage;
          sqlite3_file * const pFile = sqlite3PagerFile(pDestPager);
          Pgno iPg;
          int nDstPage;
          i64 iOff;
          i64 iEnd;

          assert( pFile );
          assert( nDestTruncate==0 
              || (i64)nDestTruncate*(i64)pgszDest >= iSize || (
                nDestTruncate==(int)(PENDING_BYTE_PAGE(p->pDest->pBt)-1)
             && iSize>=PENDING_BYTE && iSize<=PENDING_BYTE+pgszDest
          ));

          /* This block ensures that all data required to recreate the original
          ** database has been stored in the journal for pDestPager and the
          ** journal synced to disk. So at this point we may safely modify
          ** the database file in any way, knowing that if a power failure
          ** occurs, the original database will be reconstructed from the 
          ** journal file.  */
          sqlite3PagerPagecount(pDestPager, &nDstPage);
          for(iPg=nDestTruncate; rc==SQLITE_OK && iPg<=(Pgno)nDstPage; iPg++){
            if( iPg!=PENDING_BYTE_PAGE(p->pDest->pBt) ){
              DbPage *pPg;
              rc = sqlite3PagerGet(pDestPager, iPg, &pPg);
              if( rc==SQLITE_OK ){
                rc = sqlite3PagerWrite(pPg);
                sqlite3PagerUnref(pPg);
              }
            }
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 1);
          }

          /* Write the extra pages and truncate the database file as required */
          iEnd = MIN(PENDING_BYTE + pgszDest, iSize);
          for(
            iOff=PENDING_BYTE+pgszSrc; 
            rc==SQLITE_OK && iOff<iEnd; 
            iOff+=pgszSrc
          ){
            PgHdr *pSrcPg = 0;
            const Pgno iSrcPg = (Pgno)((iOff/pgszSrc)+1);
            rc = sqlite3PagerGet(pSrcPager, iSrcPg, &pSrcPg);
            if( rc==SQLITE_OK ){
              u8 *zData = sqlite3PagerGetData(pSrcPg);
              rc = sqlite3OsWrite(pFile, zData, pgszSrc, iOff);
            }
            sqlite3PagerUnref(pSrcPg);
          }
          if( rc==SQLITE_OK ){
            rc = backupTruncateFile(pFile, iSize);
          }

          /* Sync the database file to disk. */
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerSync(pDestPager);
          }
        }else{
          sqlite3PagerTruncateImage(pDestPager, nDestTruncate);
          rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 0);
        }
    
        /* Finish committing the transaction to the destination database. */
        if( SQLITE_OK==rc
         && SQLITE_OK==(rc = sqlite3BtreeCommitPhaseTwo(p->pDest, 0))
        ){
          rc = SQLITE_DONE;
        }
      }
    }
  
    /* If bCloseTrans is true, then this function opened a read transaction
    ** on the source database. Close the read transaction here. There is
    ** no need to check the return values of the btree methods here, as
    ** "committing" a read-only transaction cannot fail.
    */
    if( bCloseTrans ){
      TESTONLY( int rc2 );
      TESTONLY( rc2  = ) sqlite3BtreeCommitPhaseOne(p->pSrc, 0);
      TESTONLY( rc2 |= ) sqlite3BtreeCommitPhaseTwo(p->pSrc, 0);
      assert( rc2==SQLITE_OK );
    }
  
    if( rc==SQLITE_IOERR_NOMEM ){
      rc = SQLITE_NOMEM;
    }
    p->rc = rc;
  }
  if( p->pDestDb ){
    sqlite3_mutex_leave(p->pDestDb->mutex);
  }
  sqlite3BtreeLeave(p->pSrc);
  sqlite3_mutex_leave(p->pSrcDb->mutex);
  return rc;
}